

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_function_unary.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
lf::mesh::utils::internal::UnaryOpMinus::operator()
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,UnaryOpMinus *this,
          vector<double,_std::allocator<double>_> *u,int param_2)

{
  Stride<0,_0> *this_00;
  double *pdVar1;
  size_type sVar2;
  NegativeReturnType local_d0;
  Stride<0,_0> local_a2;
  undefined1 local_a0 [8];
  Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> rm;
  allocator<double> local_69;
  undefined1 local_68 [8];
  vector<double,_std::allocator<double>_> result;
  undefined1 local_48 [8];
  Map<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> um;
  int param_2_local;
  vector<double,_std::allocator<double>_> *u_local;
  UnaryOpMinus *this_local;
  
  um._28_4_ = param_2;
  pdVar1 = std::vector<double,_std::allocator<double>_>::data(u);
  sVar2 = std::vector<double,_std::allocator<double>_>::size(u);
  this_00 = (Stride<0,_0> *)
            ((long)&result.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 6);
  Eigen::Stride<0,_0>::Stride(this_00);
  Eigen::Map<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> *)local_48,
             pdVar1,1,sVar2,this_00);
  sVar2 = std::vector<double,_std::allocator<double>_>::size(u);
  std::allocator<double>::allocator(&local_69);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_68,sVar2,&local_69);
  std::allocator<double>::~allocator(&local_69);
  pdVar1 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)local_68);
  sVar2 = std::vector<double,_std::allocator<double>_>::size(u);
  Eigen::Stride<0,_0>::Stride(&local_a2);
  Eigen::Map<Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>::Map
            ((Map<Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_> *)local_a0,pdVar1
             ,1,sVar2,&local_a2);
  Eigen::
  DenseBase<Eigen::Map<const_Eigen::Matrix<double,_1,_-1,_1,_1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
  operator-(&local_d0,
            (DenseBase<Eigen::Map<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>
             *)local_48);
  Eigen::Map<Eigen::Matrix<double,1,-1,1,1,-1>,0,Eigen::Stride<0,0>>::operator=
            ((Map<Eigen::Matrix<double,1,_1,1,1,_1>,0,Eigen::Stride<0,0>> *)local_a0,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Map<const_Eigen::Matrix<double,_1,__1,_1,_1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
              *)&local_d0);
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(vector<double,_std::allocator<double>_> *)local_68);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

auto operator()(const std::vector<U>& u, int /*unused*/) const {
    const Eigen::Map<const Eigen::Matrix<U, 1, Eigen::Dynamic>> um(u.data(), 1,
                                                                   u.size());
    std::vector<U> result(u.size());
    Eigen::Map<Eigen::Matrix<U, 1, Eigen::Dynamic>> rm(result.data(), 1,
                                                       u.size());
    rm = -um;
    return result;
  }